

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void set_model_details(vrna_md_t *md)

{
  if (md != (vrna_md_t *)0x0) {
    memset(md,0,0x7e8);
    md->dangles = dangles;
    md->special_hp = tetra_loop;
    md->noLP = noLonelyPairs;
    md->noGU = noGU;
    md->noGUclosure = no_closingGU;
    md->logML = logML;
    md->gquad = gquad;
    md->circ = circ;
    md->uniq_ML = uniq_ML;
    md->compute_bpp = do_backtrack;
    md->backtrack = 1;
    md->backtrack_type = backtrack_type;
    md->energy_set = energy_set;
    md->max_bp_span = max_bp_span;
    md->min_loop_size = 3;
    md->window_size = -1;
    md->oldAliEn = oldAliEn;
    md->ribo = ribo;
    md->cv_fact = cv_fact;
    md->nc_fact = nc_fact;
    md->temperature = temperature;
    md->betaScale = 1.0;
    md->pf_smooth = 1;
    md->sfact = 1.07;
    if (nonstandards != (char *)0x0) {
      copy_nonstandards(md,nonstandards);
    }
    vrna_md_update(md);
    return;
  }
  return;
}

Assistant:

PUBLIC void
set_model_details(vrna_md_t *md)
{
  if (md) {
    /* make sure there are no uninitialized data fields */
    memset(md, 0, sizeof(vrna_md_t));

    md->dangles         = dangles;
    md->special_hp      = tetra_loop;
    md->noLP            = noLonelyPairs;
    md->noGU            = noGU;
    md->noGUclosure     = no_closingGU;
    md->logML           = logML;
    md->gquad           = gquad;
    md->circ            = circ;
    md->uniq_ML         = uniq_ML;
    md->compute_bpp     = do_backtrack;
    md->backtrack       = VRNA_MODEL_DEFAULT_BACKTRACK;
    md->backtrack_type  = backtrack_type;
    md->energy_set      = energy_set;
    md->max_bp_span     = max_bp_span;
    md->min_loop_size   = TURN;
    md->window_size     = VRNA_MODEL_DEFAULT_WINDOW_SIZE;
    md->oldAliEn        = oldAliEn;
    md->ribo            = ribo;
    md->cv_fact         = cv_fact;
    md->nc_fact         = nc_fact;
    md->temperature     = temperature;
    md->betaScale       = VRNA_MODEL_DEFAULT_BETA_SCALE;
    md->pf_smooth       = VRNA_MODEL_DEFAULT_PF_SMOOTH;
    md->sfact           = 1.07;

    if (nonstandards)
      copy_nonstandards(md, nonstandards);

    /* set default values for the pair/rtype[pair] stuff */
    vrna_md_update(md);
  }
}